

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

uint ImGui::RoundScalarWithFormatT<unsigned_int,int>(char *format,ImGuiDataType data_type,uint v)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  size_t fmt_out_size;
  double dVar4;
  undefined8 extraout_XMM0_Qb;
  undefined4 local_7c;
  char v_str [64];
  char fmt_sanitized [32];
  
  local_7c = v;
  pcVar3 = ImParseFormatFindStart(format);
  if ((*pcVar3 == '%') && (pcVar3[1] != '%')) {
    SanitizeFormatString(pcVar3,fmt_sanitized,fmt_out_size);
    ImFormatString(v_str,0x40,fmt_sanitized,(ulong)v);
    pcVar3 = (char *)((long)&local_7c + 3);
    do {
      pcVar1 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
    } while (*pcVar1 == ' ');
    if ((data_type & 0xfffffffeU) == 8) {
      dVar4 = atof(pcVar3);
      auVar2._8_8_ = extraout_XMM0_Qb;
      auVar2._0_8_ = dVar4;
      v = vcvttsd2usi_avx512f(auVar2);
    }
    else {
      ImAtoi<int>(pcVar3,&local_7c);
      v = local_7c;
    }
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}